

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5Porter_Ostar(char *zStem,int nStem)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  if (2 < (byte)(zStem[(long)nStem + -1] + 0x89U)) {
    uVar4 = 0;
    uVar2 = (ulong)(uint)nStem;
    if (nStem < 1) {
      uVar2 = uVar4;
    }
    uVar3 = 0;
    uVar1 = 0;
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = fts5PorterIsVowel(zStem[uVar4],uVar1);
      uVar1 = uVar1 ^ 1;
      uVar3 = uVar1 + uVar3 * 2;
    }
    uVar3 = (uint)((uVar3 & 7) == 5);
  }
  return uVar3;
}

Assistant:

static int fts5Porter_Ostar(char *zStem, int nStem){
  if( zStem[nStem-1]=='w' || zStem[nStem-1]=='x' || zStem[nStem-1]=='y' ){
    return 0;
  }else{
    int i;
    int mask = 0;
    int bCons = 0;
    for(i=0; i<nStem; i++){
      bCons = !fts5PorterIsVowel(zStem[i], bCons);
      assert( bCons==0 || bCons==1 );
      mask = (mask << 1) + bCons;
    }
    return ((mask & 0x0007)==0x0005);
  }
}